

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command-bind.h
# Opt level: O0

CommandReturnType1<dynamicgraph::CustomEntity,_int,_int> * __thiscall
dynamicgraph::command::CommandReturnType1<dynamicgraph::CustomEntity,_int,_int>::doExecute
          (CommandReturnType1<dynamicgraph::CustomEntity,_int,_int> *this)

{
  int iVar1;
  vector<dynamicgraph::command::Value,_std::allocator<dynamicgraph::command::Value>_> *pvVar2;
  size_type sVar3;
  long in_RSI;
  result_type local_3c;
  undefined1 local_35;
  EitherType local_28 [12];
  int local_1c [2];
  int val;
  CommandReturnType1<dynamicgraph::CustomEntity,_int,_int> *this_local;
  Value *res;
  
  this_local = this;
  pvVar2 = (vector<dynamicgraph::command::Value,_std::allocator<dynamicgraph::command::Value>_> *)
           dynamicgraph::command::Command::getParameterValues();
  sVar3 = std::vector<dynamicgraph::command::Value,_std::allocator<dynamicgraph::command::Value>_>::
          size(pvVar2);
  if (sVar3 != 1) {
    __assert_fail("getParameterValues().size() == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/stack-of-tasks[P]dynamic-graph/include/dynamic-graph/command-bind.h"
                  ,0x334,
                  "virtual Value dynamicgraph::command::CommandReturnType1<dynamicgraph::CustomEntity, int, int>::doExecute() [E = dynamicgraph::CustomEntity, ReturnType = int, T = int]"
                 );
  }
  pvVar2 = (vector<dynamicgraph::command::Value,_std::allocator<dynamicgraph::command::Value>_> *)
           dynamicgraph::command::Command::getParameterValues();
  std::vector<dynamicgraph::command::Value,_std::allocator<dynamicgraph::command::Value>_>::
  operator[](pvVar2,0);
  dynamicgraph::command::Value::value();
  iVar1 = dynamicgraph::command::EitherType::operator_cast_to_int(local_28);
  dynamicgraph::command::EitherType::~EitherType(local_28);
  local_35 = 0;
  local_1c[0] = iVar1;
  local_3c = boost::function1<int,_const_int_&>::operator()
                       ((function1<int,_const_int_&> *)(in_RSI + 0x60),local_1c);
  dynamicgraph::command::Value::Value((Value *)this,&local_3c);
  return this;
}

Assistant:

virtual Value doExecute() {
    assert(getParameterValues().size() == 1);
    T val = getParameterValues()[0].value();
    Value res(fptr(val));
    return res;
  }